

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O1

int Aig_ManPropagateBuffers(Aig_Man_t *p,int fUpdateLevel)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pObj;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x1b4,"int Aig_ManPropagateBuffers(Aig_Man_t *, int)");
  }
  pVVar1 = p->vBufs;
  uVar2 = pVVar1->nSize;
  if ((int)uVar2 < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar1->pArray[(ulong)uVar2 - 1];
      if ((*(uint *)&pObj->field_0x18 & 7) == 4) {
        if (p->pFanData == (int *)0x0) {
LAB_006c03fa:
          __assert_fail("p->pFanData && pObj->Id < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x147,"Aig_Obj_t *Aig_ObjFanout0(Aig_Man_t *, Aig_Obj_t *)");
        }
        do {
          if (p->nFansAlloc <= pObj->Id) goto LAB_006c03fa;
          uVar2 = p->pFanData[(long)pObj->Id * 5] >> 1;
          if (((int)uVar2 < 0) || (p->vObjs->nSize <= (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj = (Aig_Obj_t *)p->vObjs->pArray[uVar2];
        } while ((*(uint *)&pObj->field_0x18 & 7) == 4);
      }
      Aig_NodeFixBufferFanins(p,pObj,fUpdateLevel);
      if (iVar3 == 0xf4241) {
        puts("Error: A cycle is encountered while propagating buffers.");
        return 0xf4241;
      }
      iVar3 = iVar3 + 1;
      pVVar1 = p->vBufs;
      uVar2 = pVVar1->nSize;
    } while (0 < (int)uVar2);
  }
  return iVar3;
}

Assistant:

int Aig_ManPropagateBuffers( Aig_Man_t * p, int fUpdateLevel )
{
    Aig_Obj_t * pObj;
    int nSteps;
    assert( p->pFanData );
    for ( nSteps = 0; Vec_PtrSize(p->vBufs) > 0; nSteps++ )
    {
        // get the node with a buffer fanin
        for ( pObj = (Aig_Obj_t *)Vec_PtrEntryLast(p->vBufs); Aig_ObjIsBuf(pObj); pObj = Aig_ObjFanout0(p, pObj) );
        // replace this node by a node without buffer
        Aig_NodeFixBufferFanins( p, pObj, fUpdateLevel );
        // stop if a cycle occured
        if ( nSteps > 1000000 )
        {
            printf( "Error: A cycle is encountered while propagating buffers.\n" );
            break;
        }
    }
    return nSteps;
}